

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrqfa.cc
# Opt level: O3

void predict_or_learn<true>(LRQFAstate *lrq,single_learner *base,example *ec)

{
  size_t *__s;
  features *this;
  byte bVar1;
  vw *pvVar2;
  _func_void_weight_ptr_void_ptr *p_Var3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar5;
  int iVar6;
  uint64_t *puVar7;
  byte *pbVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  byte *pbVar12;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var13;
  ostream *poVar14;
  char *pcVar15;
  size_type sVar16;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar17;
  byte bVar18;
  uint32_t *puVar19;
  ulong uVar20;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar21;
  uint uVar22;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar23;
  LRQFAstate *pLVar24;
  ulong uVar25;
  float *pfVar26;
  ulong uVar27;
  byte *pbVar28;
  byte *pbVar29;
  v_array<unsigned_char> *__range1;
  example *peVar30;
  float fVar31;
  uint64_t index;
  char *new_feature;
  char *new_space;
  stringstream new_feature_buffer;
  float local_2b0;
  float local_2ac;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  undefined1 local_298 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_258;
  example *local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_230;
  single_learner *local_228;
  byte *local_220;
  byte *local_218;
  byte *local_210;
  ulong local_208;
  features *local_200;
  ulong local_1f8;
  ulong local_1f0;
  uint64_t local_1e8;
  ulong local_1e0;
  unsigned_long local_1d8;
  ulong local_1d0;
  char *local_1c8;
  char *local_1c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b8;
  float *local_1b0;
  undefined1 local_1a8 [376];
  
  pvVar2 = lrq->all;
  __s = lrq->orig_size;
  local_228 = base;
  memset(__s,0,0x800);
  pbVar28 = (ec->super_example_predict).indices._end;
  for (pbVar12 = (ec->super_example_predict).indices._begin; pbVar12 != pbVar28;
      pbVar12 = pbVar12 + 1) {
    bVar1 = *pbVar12;
    __s[bVar1] = (long)(ec->super_example_predict).feature_space[bVar1].values._end -
                 (long)(ec->super_example_predict).feature_space[bVar1].values._begin >> 2;
  }
  local_298._32_8_ = ZEXT48((uint)lrq->k);
  local_268._8_8_ = ec->example_counter;
  local_268._M_allocated_capacity._0_4_ = SQRT((float)local_298._32_8_);
  local_298._44_4_ = (ec->l).simple.label;
  local_298._24_8_ = (ec->super_example_predict).feature_space;
  puVar19 = &(pvVar2->weights).dense_weights._stride_shift;
  puVar7 = &(pvVar2->weights).dense_weights._weight_mask;
  if ((pvVar2->weights).sparse != false) {
    puVar19 = &(pvVar2->weights).sparse_weights._stride_shift;
    puVar7 = &(pvVar2->weights).sparse_weights._weight_mask;
  }
  local_1e8 = *puVar7;
  local_248 = (ulong)*puVar19;
  local_258 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&(pvVar2->weights).sparse_weights;
  bVar9 = true;
  local_2ac = 0.0;
  local_2b0 = 0.0;
  local_298._16_8_ = lrq;
  local_250 = ec;
  do {
    sVar16 = *(size_type *)(local_298._16_8_ + 0x10);
    pLVar24 = (LRQFAstate *)local_298._16_8_;
    peVar30 = local_250;
    if (sVar16 != 0) {
      pbVar12 = (byte *)(((string *)(local_298._16_8_ + 8))->_M_dataplus)._M_p;
      local_220 = pbVar12;
      do {
        pbVar28 = local_220 + 1;
        pbVar8 = pbVar28;
        local_218 = local_220;
        if (pbVar28 != pbVar12 + sVar16) {
          do {
            local_220 = pbVar8;
            pbVar29 = pbVar28;
            pbVar8 = local_218;
            if ((local_268._8_8_ & 1) == 0) {
              pbVar29 = local_218;
              pbVar8 = pbVar28;
            }
            uVar25 = (ulong)*pbVar8;
            uVar20 = __s[uVar25];
            if (uVar20 != 0) {
              bVar1 = *pbVar29;
              local_238 = (ulong)bVar1;
              local_200 = (features *)(local_298._24_8_ + uVar25 * 0x68);
              local_1e0 = (ulong)(uint)(pLVar24->field_id[local_238] * (int)local_298._32_8_);
              this = (features *)(local_298._24_8_ + local_238 * 0x68);
              local_1f0 = (ulong)(uint)(pLVar24->field_id[uVar25] * (int)local_298._32_8_);
              local_230 = &((features *)(local_298._24_8_ + local_238 * 0x68))->space_names;
              uVar27 = 0;
              local_210 = pbVar28;
              local_208 = uVar25;
              do {
                if (local_298._32_4_ != 0) {
                  local_268._M_allocated_capacity._4_4_ = (local_200->values)._begin[uVar27];
                  local_1d8 = (local_200->indicies)._begin[uVar27];
                  uVar20 = 1;
                  local_1f8 = uVar27;
                  do {
                    ppVar23 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(((ulong)(uint)((int)uVar20 + (int)local_1e0) <<
                                  ((byte)local_248 & 0x3f)) + local_1d8);
                    uVar25 = (ulong)ppVar23 & local_1e8;
                    local_240 = uVar20;
                    if ((pvVar2->weights).sparse == true) {
                      local_2a8.
                      super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)
                                (uVar25 & (pvVar2->weights).sparse_weights._weight_mask);
                      _Var13._M_cur =
                           (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(local_258,(key_type *)&local_2a8);
                      if (_Var13._M_cur == (__node_type *)0x0) {
                        local_1b0 = calloc_or_throw<float>
                                              (1L << ((byte)(pvVar2->weights).sparse_weights.
                                                            _stride_shift & 0x3f));
                        this_01 = local_258;
                        local_1b8 = local_2a8.
                                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr;
                        std::
                        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        ::_M_emplace<std::pair<unsigned_long,float*>>
                                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                    *)local_258,&local_1b8);
                        _Var13._M_cur =
                             (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find(this_01,(key_type *)&local_2a8);
                        p_Var3 = (pvVar2->weights).sparse_weights.fun;
                        if (p_Var3 != (_func_void_weight_ptr_void_ptr *)0x0) {
                          (*p_Var3)(*(weight **)((long)_Var13._M_cur + 0x10),
                                    (pvVar2->weights).sparse_weights.default_data);
                        }
                      }
                      pfVar26 = *(float **)
                                 ((long)&((_Var13._M_cur)->
                                         super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                         ).
                                         super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                         ._M_storage._M_storage + 8);
                    }
                    else {
                      pfVar26 = (pvVar2->weights).dense_weights._begin +
                                (uVar25 & (pvVar2->weights).dense_weights._weight_mask);
                    }
                    fVar31 = (peVar30->l).simple.label;
                    if ((((fVar31 != 3.4028235e+38) || (NAN(fVar31))) && (*pfVar26 == 0.0)) &&
                       (!NAN(*pfVar26))) {
                      local_1b8 = ppVar23;
                      fVar31 = merand48((uint64_t *)&local_1b8);
                      *pfVar26 = (fVar31 * 0.5) / (float)local_268._M_allocated_capacity._0_4_;
                    }
                    if (__s[local_238] != 0) {
                      iVar5 = (int)local_240;
                      iVar6 = (int)local_1f0;
                      bVar18 = (byte)local_248;
                      local_1d0 = local_240 & 0xffffffff;
                      uVar22 = 1;
                      uVar20 = 0;
                      do {
                        features::push_back(this,*pfVar26 *
                                                 (float)local_268._M_allocated_capacity._4_4_ *
                                                 (this->values)._begin[uVar20],
                                            (this->indicies)._begin[uVar20] +
                                            ((ulong)(uint)(iVar5 + iVar6) << (bVar18 & 0x3f)));
                        if ((pvVar2->audit != false) || (pvVar2->hash_inv == true)) {
                          std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
                          local_2a8.
                          super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr._0_1_ = bVar1;
                          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1a8,(char *)&local_2a8,1);
                          local_2a8.
                          super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr._0_1_ = 0x5e;
                          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar14,(char *)&local_2a8,1);
                          peVar4 = local_230->_begin[uVar20].
                                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr;
                          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar14,(peVar4->second)._M_dataplus._M_p,
                                               (peVar4->second)._M_string_length);
                          local_2a8.
                          super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr = (element_type *)
                                    CONCAT71(local_2a8.
                                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr._1_7_,0x5e);
                          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar14,(char *)&local_2a8,1);
                          std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                          local_1c0 = strdup("lrqfa");
                          std::__cxx11::stringbuf::str();
                          peVar4 = local_2a8.
                                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr;
                          pcVar15 = strdup((char *)local_2a8.
                                                                                                      
                                                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                          if (peVar4 != (element_type *)local_298) {
                            operator_delete(peVar4);
                          }
                          local_1c8 = pcVar15;
                          ppVar23 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)operator_new(0x40);
                          std::
                          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::pair<char_*&,_char_*&,_true>(ppVar23,&local_1c0,&local_1c8);
                          local_2a8.
                          super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr = ppVar23;
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                          __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                                    (&local_2a8.
                                      super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,ppVar23);
                          v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::push_back(local_230,&local_2a8);
                          if (local_2a8.
                              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      (local_2a8.
                                       super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
                          }
                          std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
                          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                        }
                        uVar20 = (ulong)uVar22;
                        uVar22 = uVar22 + 1;
                      } while (uVar20 < __s[local_238]);
                    }
                    uVar22 = (int)local_240 + 1;
                    uVar20 = (ulong)uVar22;
                    peVar30 = local_250;
                  } while (uVar22 <= (uint)local_298._32_4_);
                  uVar20 = __s[local_208];
                  uVar27 = local_1f8;
                }
                uVar27 = (ulong)((int)uVar27 + 1);
              } while (uVar27 < uVar20);
              pbVar12 = (byte *)(((string *)(local_298._16_8_ + 8))->_M_dataplus)._M_p;
              sVar16 = *(size_type *)(local_298._16_8_ + 0x10);
              pLVar24 = (LRQFAstate *)local_298._16_8_;
              pbVar28 = local_210;
            }
            pbVar28 = pbVar28 + 1;
            pbVar8 = local_220;
          } while (pbVar28 != pbVar12 + sVar16);
        }
        local_220 = pbVar8;
      } while (local_220 != pbVar12 + sVar16);
    }
    (**(code **)(local_228 + 0x28))
              (*(undefined8 *)(local_228 + 0x18),*(undefined8 *)(local_228 + 0x20),peVar30);
    if (bVar9) {
      local_2ac = (peVar30->pred).scalar;
      local_2b0 = peVar30->loss;
    }
    else {
      (peVar30->pred).scalar = local_2ac;
      peVar30->loss = local_2b0;
    }
    sVar16 = (pLVar24->field_name)._M_string_length;
    if (sVar16 != 0) {
      pbVar12 = (byte *)(((string *)(local_298._16_8_ + 8))->_M_dataplus)._M_p;
      pbVar28 = pbVar12 + sVar16;
      do {
        uVar11 = local_298._24_8_;
        uVar20 = (ulong)*pbVar12;
        (((features *)(local_298._24_8_ + uVar20 * 0x68))->values)._end =
             (((features *)(local_298._24_8_ + uVar20 * 0x68))->values)._begin + __s[uVar20];
        if ((pvVar2->audit != false) || (pvVar2->hash_inv == true)) {
          uVar25 = __s[uVar20];
          psVar17 = (((features *)(local_298._24_8_ + uVar20 * 0x68))->space_names)._begin;
          psVar21 = (((features *)(local_298._24_8_ + uVar20 * 0x68))->space_names)._end;
          if (uVar25 < (ulong)((long)psVar21 - (long)psVar17 >> 4)) {
            uVar27 = uVar25 << 4 | 8;
            do {
              this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         ((long)&(psVar17->
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + uVar27);
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                psVar17 = (((features *)(uVar11 + uVar20 * 0x68))->space_names)._begin;
                psVar21 = (((features *)(uVar11 + uVar20 * 0x68))->space_names)._end;
              }
              uVar25 = uVar25 + 1;
              uVar27 = uVar27 + 0x10;
            } while (uVar25 < (ulong)((long)psVar21 - (long)psVar17 >> 4));
            uVar25 = __s[uVar20];
          }
          (((features *)(uVar11 + uVar20 * 0x68))->space_names)._end = psVar17 + uVar25;
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 != pbVar28);
    }
    local_268._8_8_ = local_268._8_8_ + 1;
    bVar10 = (bool)(bVar9 & (float)local_298._44_4_ != 3.4028235e+38);
    bVar9 = false;
  } while (bVar10);
  return;
}

Assistant:

void predict_or_learn(LRQFAstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices) lrq.orig_size[i] = ec.feature_space[i].size();

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;
  unsigned int k = lrq.k;
  float sqrtk = (float)sqrt(k);

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  uint64_t weight_mask = lrq.all->weights.mask();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa

    for (string::const_iterator i1 = lrq.field_name.begin(); i1 != lrq.field_name.end(); ++i1)
    {
      for (string::const_iterator i2 = i1 + 1; i2 != lrq.field_name.end(); ++i2)
      {
        unsigned char left = (which % 2) ? *i1 : *i2;
        unsigned char right = ((which + 1) % 2) ? *i1 : *i2;
        unsigned int lfd_id = lrq.field_id[left];
        unsigned int rfd_id = lrq.field_id[right];
        for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
        {
          features& fs = ec.feature_space[left];
          float lfx = fs.values[lfn];
          uint64_t lindex = fs.indicies[lfn];
          for (unsigned int n = 1; n <= k; ++n)
          {
            uint64_t lwindex =
                (lindex + ((uint64_t)(rfd_id * k + n) << stride_shift));  // a feature has k weights in each field
            float* lw = &all.weights[lwindex & weight_mask];
            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex) * 0.5f / sqrtk;

            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              features& rfs = ec.feature_space[right];
              //                    feature* rf = ec.atomics[right].begin + rfn;
              // NB: ec.ft_offset added by base learner
              float rfx = rfs.values[rfn];
              uint64_t rindex = rfs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)(lfd_id * k + n) << stride_shift));

              rfs.push_back(*lw * lfx * rfx, rwindex);
              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << rfs.space_names[rfn].get()->second << '^' << n;
#ifdef _WIN32
                char* new_space = _strdup("lrqfa");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrqfa");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                rfs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
    }

    for (char i : lrq.field_name)
    {
      namespace_index right = i;
      features& rfs = ec.feature_space[right];
      rfs.values.end() = rfs.values.begin() + lrq.orig_size[right];

      if (all.audit || all.hash_inv)
      {
        for (size_t j = lrq.orig_size[right]; j < rfs.space_names.size(); ++j) rfs.space_names[j].~audit_strings_ptr();

        rfs.space_names.end() = rfs.space_names.begin() + lrq.orig_size[right];
      }
    }
  }
}